

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

float If_CutDelaySpecial(If_Man_t *p,If_Cut_t *pCut,int fCarry)

{
  If_Cut_t *pIVar1;
  bool bVar2;
  float local_3c;
  int local_34;
  float local_30;
  int i;
  float Delay;
  float DelayCur;
  If_Obj_t *pLeaf;
  int fCarry_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  local_30 = -1e+20;
  if (*(uint *)&pCut->field_0x1c >> 0x18 < 4) {
    local_34 = 0;
    while( true ) {
      bVar2 = false;
      if (local_34 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
        _Delay = If_ManObj(p,(int)(&pCut[1].Area)[local_34]);
        bVar2 = _Delay != (If_Obj_t *)0x0;
      }
      if (!bVar2) break;
      pIVar1 = If_ObjCutBest(_Delay);
      if (local_30 <= If_CutDelaySpecial::Pin2Pin[fCarry][local_34] + pIVar1->Delay) {
        local_3c = If_CutDelaySpecial::Pin2Pin[fCarry][local_34] + pIVar1->Delay;
      }
      else {
        local_3c = local_30;
      }
      local_30 = local_3c;
      local_34 = local_34 + 1;
    }
    return local_30;
  }
  __assert_fail("pCut->nLeaves <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifMap.c"
                ,0x7a,"float If_CutDelaySpecial(If_Man_t *, If_Cut_t *, int)");
}

Assistant:

float If_CutDelaySpecial( If_Man_t * p, If_Cut_t * pCut, int fCarry )
{
    static float Pin2Pin[2][3] = { {1.0, 1.0, 1.0}, {1.0, 1.0, 0.0} };
    If_Obj_t * pLeaf;
    float DelayCur, Delay = -IF_FLOAT_LARGE;
    int i;
    assert( pCut->nLeaves <= 3 );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        DelayCur = If_ObjCutBest(pLeaf)->Delay;
        Delay = IF_MAX( Delay, Pin2Pin[fCarry][i] + DelayCur );
    }
    return Delay;
}